

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

CursorType * __thiscall
duckdb::QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
          (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *this,
          WindowPartitionInput *partition)

{
  unique_ptr<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>,_true>
  *this_00;
  _Tuple_impl<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
  __ptr;
  _Tuple_impl<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
  this_01;
  type pQVar1;
  
  this_00 = &this->window_cursor;
  if ((this->window_cursor).
      super_unique_ptr<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
      .super__Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false>._M_head_impl ==
      (QuantileCursor<duckdb::hugeint_t> *)0x0) {
    this_01.super__Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false>)operator_new(0xe0);
    QuantileCursor<duckdb::hugeint_t>::QuantileCursor
              ((QuantileCursor<duckdb::hugeint_t> *)
               this_01.super__Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false>.
               _M_head_impl,partition);
    __ptr.super__Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false>._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
         .super__Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false>;
    (this_00->
    super_unique_ptr<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
    .super__Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false> =
         this_01.super__Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false>.
         _M_head_impl;
    if (__ptr.super__Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false>._M_head_impl
        != (QuantileCursor<duckdb::hugeint_t> *)0x0) {
      ::std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>::operator()
                ((default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_> *)this_00,
                 (QuantileCursor<duckdb::hugeint_t> *)
                 __ptr.super__Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false>.
                 _M_head_impl);
    }
  }
  pQVar1 = unique_ptr<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>,_true>
           ::operator*(this_00);
  return pQVar1;
}

Assistant:

CursorType &GetOrCreateWindowCursor(const WindowPartitionInput &partition) {
		if (!window_cursor) {
			window_cursor = make_uniq<CursorType>(partition);
		}
		return *window_cursor;
	}